

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# speed.cc
# Opt level: O1

bool SpeedAESBlock(string *name,uint bits,string *selected)

{
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar1;
  pointer pcVar2;
  pointer pcVar3;
  bool bVar4;
  int iVar5;
  long lVar6;
  TimeResults results;
  TimeResults results_1;
  uint8_t block [16];
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> __str;
  uint local_1ec;
  string local_1e8;
  TimeResults local_1c8;
  undefined8 local_1b8;
  undefined8 uStack_1b0;
  _Any_data local_1a8;
  code *local_198;
  code *pcStack_190;
  _Any_data local_188;
  code *local_178;
  code *pcStack_170;
  _Any_data local_168;
  code *local_158;
  code *pcStack_150;
  _Any_data local_148;
  code *local_138;
  code *pcStack_130;
  undefined1 local_128 [248];
  
  local_1ec = bits;
  if ((selected->_M_string_length != 0) &&
     (lVar6 = std::__cxx11::string::find((char *)name,(ulong)(selected->_M_dataplus)._M_p,0),
     lVar6 == -1)) {
    return true;
  }
  local_148._8_8_ = 0;
  pcStack_130 = std::
                _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
                ::_M_invoke;
  local_138 = std::
              _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:610:41)>
              ::_M_manager;
  local_148._M_unused._M_object = &local_1ec;
  bVar4 = TimeFunctionParallel((TimeResults *)&local_1e8,(function<bool_()> *)&local_148);
  if (local_138 != (code *)0x0) {
    (*local_138)(&local_148,&local_148,__destroy_functor);
  }
  pcVar3 = local_128 + 0x10;
  if (bVar4) {
    pcVar2 = (name->_M_dataplus)._M_p;
    local_128._0_8_ = pcVar3;
    std::__cxx11::string::_M_construct<char*>
              ((string *)local_128,pcVar2,pcVar2 + name->_M_string_length);
    std::__cxx11::string::append((char *)local_128);
    TimeResults::Print((TimeResults *)&local_1e8,(string *)local_128);
    if ((pointer)local_128._0_8_ != pcVar3) {
      operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
    }
  }
  else {
    SpeedAESBlock();
  }
  if (bVar4) {
    iVar5 = AES_set_encrypt_key("",local_1ec,(AES_KEY *)local_128);
    if (iVar5 == 0) {
      local_168._M_unused._M_object = &local_1b8;
      local_1b8 = 0;
      uStack_1b0 = 0;
      pcStack_150 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                    ::_M_invoke;
      local_158 = std::
                  _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:627:41)>
                  ::_M_manager;
      local_168._8_8_ = (AES_KEY *)local_128;
      bVar4 = TimeFunctionParallel(&local_1c8,(function<bool_()> *)&local_168);
      if (local_158 != (code *)0x0) {
        (*local_158)(&local_168,&local_168,__destroy_functor);
      }
      paVar1 = &local_1e8.field_2;
      if (bVar4) {
        pcVar2 = (name->_M_dataplus)._M_p;
        local_1e8._M_dataplus._M_p = (pointer)paVar1;
        std::__cxx11::string::_M_construct<char*>
                  ((string *)&local_1e8,pcVar2,pcVar2 + name->_M_string_length);
        std::__cxx11::string::append((char *)&local_1e8);
        TimeResults::Print(&local_1c8,&local_1e8);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)local_1e8._M_dataplus._M_p != paVar1) {
          operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1);
        }
      }
      else {
        SpeedAESBlock();
      }
      if (bVar4) {
        local_188._8_8_ = 0;
        pcStack_170 = std::
                      _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                      ::_M_invoke;
        local_178 = std::
                    _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:639:41)>
                    ::_M_manager;
        local_188._M_unused._M_object = &local_1ec;
        bVar4 = TimeFunctionParallel((TimeResults *)&local_1e8,(function<bool_()> *)&local_188);
        if (local_178 != (code *)0x0) {
          (*local_178)(&local_188,&local_188,__destroy_functor);
        }
        if (bVar4) {
          pcVar2 = (name->_M_dataplus)._M_p;
          local_128._0_8_ = pcVar3;
          std::__cxx11::string::_M_construct<char*>
                    ((string *)local_128,pcVar2,pcVar2 + name->_M_string_length);
          std::__cxx11::string::append((char *)local_128);
          TimeResults::Print((TimeResults *)&local_1e8,(string *)local_128);
          if ((pointer)local_128._0_8_ != pcVar3) {
            operator_delete((void *)local_128._0_8_,local_128._16_8_ + 1);
          }
        }
        else {
          SpeedAESBlock();
        }
        if (bVar4) {
          iVar5 = AES_set_decrypt_key("",local_1ec,(AES_KEY *)local_128);
          if (iVar5 == 0) {
            local_1b8 = 0;
            uStack_1b0 = 0;
            local_1a8._M_unused._M_object = &local_1b8;
            pcStack_190 = std::
                          _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                          ::_M_invoke;
            local_198 = std::
                        _Function_handler<bool_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/tool/speed.cc:656:41)>
                        ::_M_manager;
            local_1a8._8_8_ = (AES_KEY *)local_128;
            bVar4 = TimeFunctionParallel(&local_1c8,(function<bool_()> *)&local_1a8);
            if (local_198 != (code *)0x0) {
              (*local_198)(&local_1a8,&local_1a8,__destroy_functor);
            }
            if (bVar4) {
              pcVar3 = (name->_M_dataplus)._M_p;
              local_1e8._M_dataplus._M_p = (pointer)paVar1;
              std::__cxx11::string::_M_construct<char*>
                        ((string *)&local_1e8,pcVar3,pcVar3 + name->_M_string_length);
              std::__cxx11::string::append((char *)&local_1e8);
              TimeResults::Print(&local_1c8,&local_1e8);
              if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)local_1e8._M_dataplus._M_p == paVar1) {
                return bVar4;
              }
              operator_delete(local_1e8._M_dataplus._M_p,local_1e8.field_2._M_allocated_capacity + 1
                             );
              return bVar4;
            }
            SpeedAESBlock();
            return bVar4;
          }
        }
      }
    }
  }
  return false;
}

Assistant:

static bool SpeedAESBlock(const std::string &name, unsigned bits,
                          const std::string &selected) {
  if (!selected.empty() && name.find(selected) == std::string::npos) {
    return true;
  }

  static const uint8_t kZero[32] = {0};

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_encrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_encrypt_key failed.\n");
      return false;
    }
    results.Print(name + " encrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_encrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_encrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_encrypt failed.\n");
      return false;
    }
    results.Print(name + " encrypt");
  }

  {
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_KEY key;
          return AES_set_decrypt_key(kZero, bits, &key) == 0;
        })) {
      fprintf(stderr, "AES_set_decrypt_key failed.\n");
      return false;
    }
    results.Print(name + " decrypt setup");
  }

  {
    AES_KEY key;
    if (AES_set_decrypt_key(kZero, bits, &key) != 0) {
      return false;
    }
    uint8_t block[16] = {0};
    TimeResults results;
    if (!TimeFunctionParallel(&results, [&]() -> bool {
          AES_decrypt(block, block, &key);
          return true;
        })) {
      fprintf(stderr, "AES_decrypt failed.\n");
      return false;
    }
    results.Print(name + " decrypt");
  }

  return true;
}